

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_flags_encoder.c
# Opt level: O1

lzma_ret lzma_stream_header_encode(lzma_stream_flags *options,uint8_t *out)

{
  uint32_t uVar1;
  lzma_ret lVar2;
  
  lVar2 = LZMA_OPTIONS_ERROR;
  if (options->version == 0) {
    out[4] = 'Z';
    out[5] = '\0';
    out[0] = 0xfd;
    out[1] = '7';
    out[2] = 'z';
    out[3] = 'X';
    lVar2 = LZMA_PROG_ERROR;
    if (options->check < 0x10) {
      out[6] = '\0';
      out[7] = (char)options->check;
      lVar2 = LZMA_OK;
      uVar1 = lzma_crc32(out + 6,2,0);
      *(uint32_t *)(out + 8) = uVar1;
    }
  }
  return lVar2;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_stream_header_encode(const lzma_stream_flags *options, uint8_t *out)
{
	assert(sizeof(lzma_header_magic) + LZMA_STREAM_FLAGS_SIZE
			+ 4 == LZMA_STREAM_HEADER_SIZE);

	if (options->version != 0)
		return LZMA_OPTIONS_ERROR;

	// Magic
	memcpy(out, lzma_header_magic, sizeof(lzma_header_magic));

	// Stream Flags
	if (stream_flags_encode(options, out + sizeof(lzma_header_magic)))
		return LZMA_PROG_ERROR;

	// CRC32 of the Stream Header
	const uint32_t crc = lzma_crc32(out + sizeof(lzma_header_magic),
			LZMA_STREAM_FLAGS_SIZE, 0);

	unaligned_write32le(out + sizeof(lzma_header_magic)
			+ LZMA_STREAM_FLAGS_SIZE, crc);

	return LZMA_OK;
}